

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::SearchRE2(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  int iVar1;
  bool bVar2;
  RE2 re;
  LogMessageFatal local_290;
  RE2 local_110;
  
  iVar1 = 0;
  if (0 < iters) {
    iVar1 = iters;
  }
  do {
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) {
      return;
    }
    RE2::RE2(&local_110,regexp);
    bVar2 = std::operator==(local_110.error_,"");
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                (&local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x3b7);
      std::operator<<((ostream *)&local_290.super_LogMessage.str_,
                      "Check failed: (re.error()) == (\"\")");
      LogMessageFatal::~LogMessageFatal(&local_290);
    }
    if (anchor == kAnchored) {
      bVar2 = RE2::FullMatch<>(text,&local_110);
      if (bVar2 != expect_match) {
        LogMessageFatal::LogMessageFatal
                  (&local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3b9);
        std::operator<<((ostream *)&local_290.super_LogMessage.str_,
                        "Check failed: (RE2::FullMatch(text, re)) == (expect_match)");
LAB_00126d11:
        LogMessageFatal::~LogMessageFatal(&local_290);
      }
    }
    else {
      bVar2 = RE2::PartialMatch<>(text,&local_110);
      if (bVar2 != expect_match) {
        LogMessageFatal::LogMessageFatal
                  (&local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3bb);
        std::operator<<((ostream *)&local_290.super_LogMessage.str_,
                        "Check failed: (RE2::PartialMatch(text, re)) == (expect_match)");
        goto LAB_00126d11;
      }
    }
    RE2::~RE2(&local_110);
  } while( true );
}

Assistant:

void SearchRE2(int iters, const char* regexp, const StringPiece& text,
               Prog::Anchor anchor, bool expect_match) {
  for (int i = 0; i < iters; i++) {
    RE2 re(regexp);
    CHECK_EQ(re.error(), "");
    if (anchor == Prog::kAnchored)
      CHECK_EQ(RE2::FullMatch(text, re), expect_match);
    else
      CHECK_EQ(RE2::PartialMatch(text, re), expect_match);
  }
}